

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_convolve_2d_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 local_8b28 [35584];
  
  if (-1 < h) {
    uVar6 = (ulong)(uint)w;
    lVar3 = (long)w * 2;
    puVar8 = local_8b28;
    iVar4 = 0;
    do {
      if (0 < w) {
        uVar9 = 0;
        bVar1 = *src;
        do {
          bVar2 = src[uVar9 + 1];
          *(ushort *)(puVar8 + uVar9 * 2) = (ushort)bVar2 + (ushort)bVar1 + 0x100;
          uVar9 = uVar9 + 1;
          bVar1 = bVar2;
        } while (uVar6 != uVar9);
      }
      src = src + src_stride;
      puVar8 = puVar8 + lVar3;
      bVar10 = iVar4 != h;
      iVar4 = iVar4 + 1;
    } while (bVar10);
    if (h != 0) {
      puVar7 = local_8b28 + uVar6 * 2;
      puVar8 = local_8b28;
      iVar4 = 0;
      do {
        if (0 < w) {
          uVar9 = 0;
          do {
            iVar5 = ((int)*(short *)(puVar7 + uVar9 * 2) + (int)*(short *)(puVar8 + uVar9 * 2)) *
                    0x4000 + -0x7f8000 >> 0x10;
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (0xfe < iVar5) {
              iVar5 = 0xff;
            }
            dst[uVar9] = (uint8_t)iVar5;
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        dst = dst + dst_stride;
        iVar4 = iVar4 + 1;
        puVar7 = puVar7 + lVar3;
        puVar8 = puVar8 + lVar3;
      } while (iVar4 != h);
    }
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_intrabc_c(const uint8_t *src, int src_stride,
                                  uint8_t *dst, int dst_stride, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_x_qn, const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int bd = 8;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum = (1 << bd) + src[x] + src[x + 1];
      assert(0 <= sum && sum < (1 << (bd + 2)));
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << (bd + 2)) + src_vert[x] + src_vert[im_stride + x];
      assert(0 <= sum && sum < (1 << (bd + 4)));
      const int16_t res =
          ROUND_POWER_OF_TWO(sum, 2) - ((1 << bd) + (1 << (bd - 1)));
      dst[x] = clip_pixel(res);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}